

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::MILSpec::Block::_InternalSerialize
          (Block *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  NamedValueType *value;
  string *s_00;
  char *data;
  size_t __n;
  void *pvVar7;
  Operation *value_00;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  *pMVar8;
  size_type sVar9;
  ulong uVar10;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  **__p;
  type ppMVar11;
  type ppMVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  const_pointer pvVar14;
  const_reference pvVar15;
  void *__dest;
  const_iterator local_120;
  undefined1 local_108 [8];
  const_iterator it_1;
  size_type i_3;
  const_iterator local_e0;
  undefined1 local_b8 [8];
  const_iterator it;
  size_type n_3;
  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  items;
  uint n_2;
  uint i_2;
  string *s;
  int local_78;
  int n_1;
  int i_1;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Block *this_local;
  ptrdiff_t size;
  EpsCopyOutputStream *local_28;
  
  i_1 = 0;
  uVar3 = _internal_inputs_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; (uint)i_1 < uVar3; i_1 = i_1 + 1) {
    puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _internal_inputs(this,i_1);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::NamedValueType>
                             (1,value,puVar6,stream);
  }
  local_78 = 0;
  iVar4 = _internal_outputs_size(this);
  for (; local_78 < iVar4; local_78 = local_78 + 1) {
    s_00 = _internal_outputs_abi_cxx11_(this,local_78);
    data = (char *)std::__cxx11::string::data();
    iVar5 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,iVar5,SERIALIZE,"CoreML.Specification.MILSpec.Block.outputs");
    __n = std::__cxx11::string::size();
    bVar2 = true;
    if ((long)__n < 0x80) {
      puVar6 = stream->end_;
      iVar5 = google::protobuf::io::EpsCopyOutputStream::TagSize(0x10);
      bVar2 = (long)(puVar6 + (-(long)iVar5 - (long)stream_local) + 0xf) < (long)__n;
    }
    if (bVar2) {
      local_28 = (EpsCopyOutputStream *)
                 google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,2,s_00,(uint8_t *)stream_local);
    }
    else {
      *(undefined1 *)&stream_local->end_ = 0x12;
      __dest = (void *)((long)&stream_local->end_ + 2);
      *(char *)((long)&stream_local->end_ + 1) = (char)__n;
      pvVar7 = (void *)std::__cxx11::string::data();
      memcpy(__dest,pvVar7,__n);
      local_28 = (EpsCopyOutputStream *)((long)__dest + __n);
    }
    stream_local = local_28;
  }
  items._M_t.
  super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  .
  super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
  ._M_head_impl._4_4_ = 0;
  items._M_t.
  super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  .
  super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
  ._M_head_impl._0_4_ = _internal_operations_size(this);
  for (; items._M_t.
         super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
         .
         super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
         ._M_head_impl._4_4_ <
         (uint)items._M_t.
               super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
               .
               super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
               ._M_head_impl;
      items._M_t.
      super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
      .
      super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
      ._M_head_impl._4_4_ =
           items._M_t.
           super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
           .
           super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
           ._M_head_impl._4_4_ + 1) {
    puVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _internal_operations
                         (this,items._M_t.
                               super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                               .
                               super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
                               ._M_head_impl._4_4_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::Operation>
                             (3,value_00,puVar6,stream);
  }
  pMVar8 = _internal_attributes_abi_cxx11_(this);
  bVar2 = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::empty(pMVar8);
  if (!bVar2) {
    bVar2 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if (bVar2) {
      pMVar8 = _internal_attributes_abi_cxx11_(this);
      sVar9 = google::protobuf::
              Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
              ::size(pMVar8);
      if (1 < sVar9) {
        pMVar8 = _internal_attributes_abi_cxx11_(this);
        sVar9 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::size(pMVar8);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar9;
        uVar10 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar10 = 0xffffffffffffffff;
        }
        __p = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
               **)operator_new__(uVar10);
        std::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[]>>
        ::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[]>,void,bool>
                  ((unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[]>>
                    *)&n_3,__p);
        it.it_.bucket_index_ = 0;
        pMVar8 = _internal_attributes_abi_cxx11_(this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
        ::begin((const_iterator *)local_b8,pMVar8);
        while( true ) {
          pMVar8 = _internal_attributes_abi_cxx11_(this);
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::end(&local_e0,pMVar8);
          bVar2 = google::protobuf::operator!=((const_iterator *)local_b8,&local_e0);
          if (!bVar2) break;
          pvVar15 = google::protobuf::
                    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                    ::const_iterator::operator*((const_iterator *)local_b8);
          ppMVar11 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it.it_.bucket_index_);
          *ppMVar11 = pvVar15;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::const_iterator::operator++((const_iterator *)local_b8);
          it.it_.bucket_index_ = it.it_.bucket_index_ + 1;
        }
        ppMVar11 = std::
                   unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                   ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                 *)&n_3,0);
        ppMVar12 = std::
                   unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                   ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                 *)&n_3,it.it_.bucket_index_);
        std::
        sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>
                  (ppMVar11,ppMVar12);
        for (it_1.it_.bucket_index_ = 0; it_1.it_.bucket_index_ < it.it_.bucket_index_;
            it_1.it_.bucket_index_ = it_1.it_.bucket_index_ + 1) {
          ppMVar11 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_1.it_.bucket_index_);
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppMVar11;
          ppMVar11 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_1.it_.bucket_index_);
          stream_local = (EpsCopyOutputStream *)
                         google::protobuf::internal::
                         MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                         ::InternalSerialize(4,pbVar13,(Value *)(*ppMVar11 + 0x20),
                                             (uint8_t *)stream_local,stream);
          ppMVar11 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_1.it_.bucket_index_);
          _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
          Value>_const__(*ppMVar11);
        }
        std::
        unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
        ::~unique_ptr((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                       *)&n_3);
        goto LAB_00258f77;
      }
    }
    pMVar8 = _internal_attributes_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::begin((const_iterator *)local_108,pMVar8);
    while( true ) {
      pMVar8 = _internal_attributes_abi_cxx11_(this);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::end(&local_120,pMVar8);
      bVar2 = google::protobuf::operator!=((const_iterator *)local_108,&local_120);
      if (!bVar2) break;
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::const_iterator::operator->((const_iterator *)local_108);
      pvVar14 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::const_iterator::operator->((const_iterator *)local_108);
      stream_local = (EpsCopyOutputStream *)
                     google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                     ::InternalSerialize(4,pbVar13,(Value *)(pvVar14 + 0x20),(uint8_t *)stream_local
                                         ,stream);
      pvVar15 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::const_iterator::operator*((const_iterator *)local_108);
      _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::Value>_const__
                (pvVar15);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::const_iterator::operator++((const_iterator *)local_108);
    }
  }
LAB_00258f77:
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    pvVar7 = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar4 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,pvVar7,iVar4,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* Block::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.Block)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.MILSpec.NamedValueType inputs = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_inputs_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_inputs(i), target, stream);
  }

  // repeated string outputs = 2;
  for (int i = 0, n = this->_internal_outputs_size(); i < n; i++) {
    const auto& s = this->_internal_outputs(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.Block.outputs");
    target = stream->WriteString(2, s, target);
  }

  // repeated .CoreML.Specification.MILSpec.Operation operations = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_operations_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_operations(i), target, stream);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 4;
  if (!this->_internal_attributes().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Block.AttributesEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_attributes().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_attributes().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Block_AttributesEntry_DoNotUse::Funcs::InternalSerialize(4, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it) {
        target = Block_AttributesEntry_DoNotUse::Funcs::InternalSerialize(4, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.Block)
  return target;
}